

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

void Gia_ManSwapPos(Gia_Man_t *p,int i)

{
  int iVar1;
  int iLit0;
  Gia_Obj_t *pGVar2;
  int LitI;
  int Lit0;
  int i_local;
  Gia_Man_t *p_local;
  
  if ((-1 < i) && (iVar1 = Gia_ManPoNum(p), i < iVar1)) {
    if (i != 0) {
      pGVar2 = Gia_ManPo(p,0);
      iVar1 = Gia_ObjFaninLit0p(p,pGVar2);
      pGVar2 = Gia_ManPo(p,i);
      iLit0 = Gia_ObjFaninLit0p(p,pGVar2);
      Gia_ManPatchCoDriver(p,0,iLit0);
      Gia_ManPatchCoDriver(p,i,iVar1);
    }
    return;
  }
  __assert_fail("i >= 0 && i < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaUtil.c"
                ,0x65a,"void Gia_ManSwapPos(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManSwapPos( Gia_Man_t * p, int i )
{
    int Lit0, LitI;
    assert( i >= 0 && i < Gia_ManPoNum(p) );
    if ( i == 0 )
        return;
    Lit0 = Gia_ObjFaninLit0p( p, Gia_ManPo(p, 0) );
    LitI = Gia_ObjFaninLit0p( p, Gia_ManPo(p, i) );
    Gia_ManPatchCoDriver( p, 0, LitI );
    Gia_ManPatchCoDriver( p, i, Lit0 );
}